

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O0

void __thiscall EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT(EnvironmentNAVXYTHETALAT *this)

{
  long lVar1;
  size_type sVar2;
  reference ppEVar3;
  long lVar4;
  undefined8 *in_RDI;
  EnvironmentNAVXYTHETALATTICE *in_stack_00000020;
  int i;
  size_type in_stack_ffffffffffffff98;
  vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
  *in_stack_ffffffffffffffa0;
  vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
  *in_stack_ffffffffffffffb0;
  int local_c;
  
  *in_RDI = &PTR_InitializeEnv_001da6e0;
  for (local_c = 0;
      sVar2 = std::
              vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
              ::size((vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                      *)(in_RDI + 0x34)), local_c < (int)sVar2; local_c = local_c + 1) {
    ppEVar3 = std::
              vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
              ::at(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (*ppEVar3 != (value_type)0x0) {
      operator_delete(*ppEVar3,0x14);
    }
    ppEVar3 = std::
              vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
              ::at(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    *ppEVar3 = (value_type)0x0;
  }
  std::vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>::clear
            ((vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
              *)0x172516);
  if (in_RDI[0x33] != 0) {
    lVar1 = in_RDI[0x33];
    if (lVar1 != 0) {
      in_stack_ffffffffffffffb0 =
           *(vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
             **)(lVar1 + -8);
      lVar4 = lVar1 + (long)in_stack_ffffffffffffffb0 * 0x18;
      while (lVar1 != lVar4) {
        lVar4 = lVar4 + -0x18;
        std::vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>::
        ~vector(in_stack_ffffffffffffffb0);
      }
      operator_delete__((void *)(lVar1 + -8),(long)in_stack_ffffffffffffffb0 * 0x18 + 8);
    }
    in_RDI[0x33] = 0;
  }
  if (in_RDI[0x37] != 0) {
    if ((void *)in_RDI[0x37] != (void *)0x0) {
      operator_delete__((void *)in_RDI[0x37]);
    }
    in_RDI[0x37] = 0;
  }
  std::vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>::
  ~vector(in_stack_ffffffffffffffb0);
  EnvironmentNAVXYTHETALATTICE::~EnvironmentNAVXYTHETALATTICE(in_stack_00000020);
  return;
}

Assistant:

EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT()
{
    SBPL_PRINTF("destroying XYTHETALAT\n");

    // delete the states themselves first
    for (int i = 0; i < (int)StateID2CoordTable.size(); i++) {
        delete StateID2CoordTable.at(i);
        StateID2CoordTable.at(i) = NULL;
    }
    StateID2CoordTable.clear();

    // delete hashtable
    if (Coord2StateIDHashTable != NULL) {
        delete[] Coord2StateIDHashTable;
        Coord2StateIDHashTable = NULL;
    }
    if (Coord2StateIDHashTable_lookup != NULL) {
        delete[] Coord2StateIDHashTable_lookup;
        Coord2StateIDHashTable_lookup = NULL;
    }
}